

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O2

mbedtls_asn1_named_data *
mbedtls_asn1_store_named_data
          (mbedtls_asn1_named_data **head,char *oid,size_t oid_len,uchar *val,size_t val_len)

{
  mbedtls_asn1_named_data *__ptr;
  uchar *puVar1;
  uchar *puVar2;
  
  __ptr = mbedtls_asn1_find_named_data(*head,oid,oid_len);
  if (__ptr == (mbedtls_asn1_named_data *)0x0) {
    __ptr = (mbedtls_asn1_named_data *)calloc(1,0x40);
    if (__ptr == (mbedtls_asn1_named_data *)0x0) {
      return (mbedtls_asn1_named_data *)0x0;
    }
    (__ptr->oid).len = oid_len;
    puVar1 = (uchar *)calloc(1,oid_len);
    (__ptr->oid).p = puVar1;
    if (puVar1 == (uchar *)0x0) goto LAB_0016a7ec;
    memcpy(puVar1,oid,oid_len);
    (__ptr->val).len = val_len;
    puVar2 = (uchar *)calloc(1,val_len);
    (__ptr->val).p = puVar2;
    if (puVar2 != (uchar *)0x0) {
      __ptr->next = *head;
      *head = __ptr;
      goto LAB_0016a7ce;
    }
  }
  else {
    if (val_len <= (__ptr->val).len) {
LAB_0016a7ce:
      if (val != (uchar *)0x0) {
        memcpy((__ptr->val).p,val,val_len);
      }
      return __ptr;
    }
    free((__ptr->val).p);
    (__ptr->val).len = val_len;
    puVar1 = (uchar *)calloc(1,val_len);
    (__ptr->val).p = puVar1;
    if (puVar1 != (uchar *)0x0) goto LAB_0016a7ce;
    puVar1 = (__ptr->oid).p;
  }
  free(puVar1);
LAB_0016a7ec:
  free(__ptr);
  return (mbedtls_asn1_named_data *)0x0;
}

Assistant:

mbedtls_asn1_named_data *mbedtls_asn1_store_named_data( mbedtls_asn1_named_data **head,
                                        const char *oid, size_t oid_len,
                                        const unsigned char *val,
                                        size_t val_len )
{
    mbedtls_asn1_named_data *cur;

    if( ( cur = mbedtls_asn1_find_named_data( *head, oid, oid_len ) ) == NULL )
    {
        // Add new entry if not present yet based on OID
        //
        if( ( cur = mbedtls_calloc( 1, sizeof(mbedtls_asn1_named_data) ) ) == NULL )
            return( NULL );

        cur->oid.len = oid_len;
        cur->oid.p = mbedtls_calloc( 1, oid_len );
        if( cur->oid.p == NULL )
        {
            mbedtls_free( cur );
            return( NULL );
        }

        memcpy( cur->oid.p, oid, oid_len );

        cur->val.len = val_len;
        cur->val.p = mbedtls_calloc( 1, val_len );
        if( cur->val.p == NULL )
        {
            mbedtls_free( cur->oid.p );
            mbedtls_free( cur );
            return( NULL );
        }

        cur->next = *head;
        *head = cur;
    }
    else if( cur->val.len < val_len )
    {
        // Enlarge existing value buffer if needed
        //
        mbedtls_free( cur->val.p );
        cur->val.p = NULL;

        cur->val.len = val_len;
        cur->val.p = mbedtls_calloc( 1, val_len );
        if( cur->val.p == NULL )
        {
            mbedtls_free( cur->oid.p );
            mbedtls_free( cur );
            return( NULL );
        }
    }

    if( val != NULL )
        memcpy( cur->val.p, val, val_len );

    return( cur );
}